

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O2

boolean write_level_file(char *filename,sp_lev *lvl)

{
  undefined8 *puVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  ssize_t sVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  long i;
  long lVar14;
  opvar *poVar15;
  long lVar16;
  void *opdat;
  long in_stack_fffffffffffffec8;
  uint uVar17;
  int local_104;
  char *local_100;
  char lbuf [60];
  _opcode tmpo;
  
  if (decompile == 0) goto LAB_0010d9ef;
  lbuf[0] = '\0';
  strcat(lbuf,outprefix);
  strcat(lbuf,filename);
  sVar6 = strlen(lbuf);
  builtin_strncpy(lbuf + sVar6,"_lev.txt",9);
  iVar4 = open(lbuf,0x241,0x1a4);
  if (iVar4 < 0) {
    return '\0';
  }
  lVar14 = 0;
  local_100 = filename;
LAB_0010d680:
  if (lvl->n_opcodes <= lVar14) goto LAB_0010d9e1;
  uVar17 = lvl->opcodes[lVar14].opcode;
  poVar15 = lvl->opcodes[lVar14].opdat;
  if (0x4b < (ulong)(long)(int)uVar17) {
    panic("decompile_maze: unknown opcode (%i).",(ulong)uVar17);
  }
  if (uVar17 != 0x28) {
    if (poVar15 != (opvar *)0x0) {
      panic("decompile_maze: opcode (%i) has data.",(ulong)uVar17);
    }
    snprintf((char *)&tmpo,0x7f,"%li:\t%s\n",lVar14,
             &DAT_00116134 + *(int *)(&DAT_00116134 + (long)(int)uVar17 * 4));
    goto LAB_0010d82c;
  }
  if (poVar15 == (opvar *)0x0) {
    panic("decompile_maze: PUSH with no data.");
  }
  cVar2 = poVar15->spovartyp;
  uVar17 = (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  switch(cVar2) {
  case '\0':
    goto switchD_0010d6e8_caseD_0;
  case '\x01':
    pcVar13 = (poVar15->vardata).str;
    if (pcVar13 + -0x20 < (char *)0x5f) {
      in_stack_fffffffffffffec8 = (ulong)uVar17 << 0x20;
      pcVar12 = "%li:\t%s\tint:%li\t# \'%c\'\n";
    }
    else {
      pcVar12 = "%li:\t%s\tint:%li\n";
    }
    break;
  case '\x02':
  case '\x03':
    pcVar13 = (poVar15->vardata).str;
    if (pcVar13 != (char *)0x0) {
      sVar6 = strlen(pcVar13);
      iVar5 = (int)sVar6;
      if (iVar5 == 0) goto switchD_0010d6e8_caseD_0;
      if (iVar5 < 0x80) {
        uVar7 = 0;
        if (0 < iVar5) {
          uVar7 = sVar6 & 0xffffffff;
        }
        uVar11 = 0;
        do {
          if (uVar7 == uVar11) {
            pcVar12 = "%li:\t%s\tstr:\"%s\"\n";
            if (cVar2 == '\x03') {
              pcVar12 = "%li:\t%s\tvar:$%s\n";
            }
            goto LAB_0010d99b;
          }
          pcVar12 = pcVar13 + uVar11;
          uVar11 = uVar11 + 1;
        } while (0xa0 < (byte)(*pcVar12 + 0x81U));
      }
      snprintf((char *)&tmpo,0x7f,"%li:\t%s\tstr:",lVar14,"push");
      sVar9 = strlen((char *)&tmpo);
      sVar9 = write(iVar4,&tmpo,sVar9);
      sVar8 = strlen((char *)&tmpo);
      if (sVar9 == sVar8) {
        uVar7 = sVar6 & 0xffffffff;
        if (iVar5 < 1) {
          uVar7 = 0;
        }
        uVar11 = 0;
        while (uVar7 != uVar11) {
          snprintf((char *)&tmpo,0x7f,"%02x ",(ulong)(uint)(int)(poVar15->vardata).str[uVar11]);
          sVar6 = strlen((char *)&tmpo);
          sVar6 = write(iVar4,&tmpo,sVar6);
          sVar9 = strlen((char *)&tmpo);
          uVar11 = uVar11 + 1;
          if (sVar6 != sVar9) goto LAB_0010d9e1;
        }
        tmpo.opcode._0_2_ = 10;
        goto LAB_0010d82c;
      }
      goto LAB_0010d9e1;
    }
    goto switchD_0010d6e8_caseD_0;
  case '\x04':
    pcVar13 = (char *)((poVar15->vardata).l & 0xff);
    in_stack_fffffffffffffec8 = 0;
    pcVar12 = "%li:\t%s\tcoord:(%li,%li)\n";
    break;
  case '\x05':
    pcVar13 = (char *)((poVar15->vardata).l & 0xff);
    in_stack_fffffffffffffec8 = 0;
    pcVar12 = "%li:\t%s\tregion:(%li,%li,%li,%li)\n";
    break;
  case '\x06':
    in_stack_fffffffffffffec8 = CONCAT44(uVar17,(int)(char)(*(uint *)&poVar15->vardata >> 8));
    snprintf((char *)&tmpo,0x7f,"%li:\t%s\tmapchar:(%i,%i)\n",lVar14,"push",
             (ulong)(*(uint *)&poVar15->vardata & 0xff),in_stack_fffffffffffffec8);
    goto LAB_0010d82c;
  case '\a':
    pcVar13 = (char *)(ulong)(*(uint *)&poVar15->vardata >> 8 & 0xffff);
    in_stack_fffffffffffffec8 = (ulong)uVar17 << 0x20;
    pcVar12 = "%li:\t%s\tmonst:(pm=%li,class=\'%c\')\n";
    break;
  case '\b':
    pcVar13 = (char *)(ulong)(*(uint *)&poVar15->vardata >> 8 & 0xffff);
    in_stack_fffffffffffffec8 = (ulong)uVar17 << 0x20;
    pcVar12 = "%li:\t%s\tobj:(id=%li,class=\'%c\')\n";
    break;
  default:
    panic("decompile_maze: unknown data type (%i).",(ulong)(uint)(int)cVar2);
  }
LAB_0010d99b:
  snprintf((char *)&tmpo,0x7f,pcVar12,lVar14,"push",pcVar13);
LAB_0010d82c:
  sVar6 = strlen((char *)&tmpo);
  sVar6 = write(iVar4,&tmpo,sVar6);
  sVar9 = strlen((char *)&tmpo);
  if (sVar6 != sVar9) goto LAB_0010d9e1;
switchD_0010d6e8_caseD_0:
  lVar14 = lVar14 + 1;
  goto LAB_0010d680;
LAB_0010d9e1:
  close(iVar4);
  filename = local_100;
LAB_0010d9ef:
  lbuf[0] = '\0';
  strcat(lbuf,outprefix);
  strcat(lbuf,filename);
  sVar6 = strlen(lbuf);
  builtin_strncpy(lbuf + sVar6,".lev",5);
  iVar4 = open(lbuf,0x41,0x1a4);
  if (-1 < iVar4) {
    if (lvl == (sp_lev *)0x0) {
      panic("write_level_file");
    }
    if (be_verbose != 0) {
      fprintf(_stdout,"File: \'%s\', opcodes: %li\n",lbuf,lvl->n_opcodes);
    }
    sVar10 = write(iVar4,write_common_data_version_data,0xc);
    if (sVar10 == 0xc) {
      sVar10 = write(iVar4,&lvl->n_opcodes,8);
      if (sVar10 == 8) {
        lVar14 = 0;
        lVar16 = 0;
        while( true ) {
          if (lvl->n_opcodes <= lVar16) {
            free(lvl->opcodes);
            lvl->opcodes = (_opcode *)0x0;
            close(iVar4);
            return '\x01';
          }
          puVar1 = (undefined8 *)((long)&lvl->opcodes->opcode + lVar14);
          tmpo._0_8_ = *puVar1;
          tmpo.opdat = (opvar *)puVar1[1];
          sVar10 = write(iVar4,&tmpo,4);
          poVar15 = tmpo.opdat;
          if (sVar10 != 4) break;
          if (0x4b < (uint)tmpo.opcode) {
            panic("write_maze: unknown opcode (%i).",tmpo._0_8_ & 0xffffffff);
          }
          if (tmpo.opcode == 0x28) {
            if (tmpo.opdat == (opvar *)0x0) {
              panic("write_maze: PUSH with no data.");
            }
            sVar10 = write(iVar4,tmpo.opdat,1);
            if (sVar10 != 1) {
              return '\0';
            }
            bVar3 = poVar15->spovartyp;
            if (8 < bVar3) {
              pcVar13 = "write_maze: unknown data type (%i).";
              uVar17 = (int)(char)bVar3;
LAB_0010db8d:
              panic(pcVar13,(ulong)uVar17);
            }
            if ((0x1f2U >> (bVar3 & 0x1f) & 1) == 0) {
              if ((0xcU >> (bVar3 & 0x1f) & 1) != 0) {
                if ((poVar15->vardata).str == (char *)0x0) {
                  iVar5 = 0;
                }
                else {
                  sVar6 = strlen((poVar15->vardata).str);
                  iVar5 = (int)sVar6;
                }
                local_104 = iVar5;
                sVar10 = write(iVar4,&local_104,4);
                if (sVar10 != 4) {
                  return '\0';
                }
                if (iVar5 != 0) {
                  sVar6 = write(iVar4,(poVar15->vardata).str,(long)iVar5);
                  if (sVar6 != (long)iVar5) {
                    return '\0';
                  }
                  free((poVar15->vardata).str);
                }
              }
            }
            else {
              sVar10 = write(iVar4,&poVar15->vardata,8);
              if (sVar10 != 8) {
                return '\0';
              }
            }
          }
          else {
            if (tmpo.opdat != (opvar *)0x0) {
              pcVar13 = "write_maze: opcode (%i) has data.";
              uVar17 = tmpo.opcode;
              goto LAB_0010db8d;
            }
            poVar15 = (opvar *)0x0;
          }
          free(poVar15);
          lVar16 = lVar16 + 1;
          lVar14 = lVar14 + 0x10;
        }
      }
    }
  }
  return '\0';
}

Assistant:

boolean write_level_file(char *filename, sp_lev *lvl)
{
	int fout;
	char lbuf[60];

	if (decompile) {
	    lbuf[0] = '\0';
	    strcat(lbuf, outprefix);
	    strcat(lbuf, filename);
	    strcat(lbuf, "_lev.txt");
	    fout = open(lbuf, O_TRUNC|O_WRONLY|O_CREAT, OMASK);
	    if (fout < 0) return FALSE;
	    decompile_maze(fout, lvl);
	    close(fout);
	}

	lbuf[0] = '\0';
	strcat(lbuf, outprefix);
	strcat(lbuf, filename);
	strcat(lbuf, LEV_EXT);

	fout = open(lbuf, O_WRONLY|O_CREAT|O_BINARY, OMASK);
	if (fout < 0) return FALSE;

	if (!lvl) panic("write_level_file");

	if (be_verbose)
	    fprintf(stdout, "File: '%s', opcodes: %li\n", lbuf, lvl->n_opcodes);

	if (!write_maze(fout, lvl))
	    return FALSE;

	close(fout);

	return TRUE;
}